

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qparallelanimationgroup.cpp
# Opt level: O3

void __thiscall
QParallelAnimationGroupPrivate::applyGroupState
          (QParallelAnimationGroupPrivate *this,QAbstractAnimation *animation)

{
  QObjectBindableProperty<QAbstractAnimationPrivate,_QAbstractAnimation::State,_&QAbstractAnimationPrivate::_qt_property_state_offset,_nullptr>
  *data;
  State SVar1;
  QBindingStatus *pQVar2;
  
  data = &(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.state;
  pQVar2 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.super_QObjectPrivate
           .super_QObjectData.bindingStorage.bindingStatus;
  if ((pQVar2 != (QBindingStatus *)0x0) &&
     (pQVar2->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
    QBindingStorage::registerDependency_helper
              (&(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
                super_QObjectPrivate.super_QObjectData.bindingStorage,(QUntypedPropertyData *)data);
  }
  SVar1 = (data->super_QPropertyData<QAbstractAnimation::State>).val;
  if (SVar1 != Paused) {
    if (SVar1 == Running) {
      QAbstractAnimation::start((QAbstractAnimation *)animation,KeepWhenStopped);
      return;
    }
    return;
  }
  QAbstractAnimation::pause((QAbstractAnimation *)animation);
  return;
}

Assistant:

void QParallelAnimationGroupPrivate::applyGroupState(QAbstractAnimation *animation)
{
    switch (state)
    {
    case QAbstractAnimation::Running:
        animation->start();
        break;
    case QAbstractAnimation::Paused:
        animation->pause();
        break;
    case QAbstractAnimation::Stopped:
    default:
        break;
    }
}